

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_4_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_760;
  float c3s;
  float *input3;
  float *pfStack_750;
  float c2s;
  float *input2;
  float *pfStack_740;
  float c1s;
  float *input1;
  float *pfStack_730;
  float c0s;
  float *input0;
  float *output;
  float *input0_end_local;
  float **inputs_local;
  float *vertical_coefficients_local;
  float *outputp_local;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  fVar1 = *vertical_coefficients;
  pfStack_740 = inputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_750 = inputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_760 = inputs[3];
  fVar4 = vertical_coefficients[3];
  input0 = outputp;
  for (pfStack_730 = *inputs; 0x3f < (long)input0_end - (long)pfStack_730;
      pfStack_730 = pfStack_730 + 0x10) {
    local_328 = (float)*(undefined8 *)pfStack_730;
    fStack_324 = (float)((ulong)*(undefined8 *)pfStack_730 >> 0x20);
    fStack_320 = (float)*(undefined8 *)(pfStack_730 + 2);
    fStack_31c = (float)((ulong)*(undefined8 *)(pfStack_730 + 2) >> 0x20);
    local_a8 = (float)*(undefined8 *)input0;
    fStack_a4 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(input0 + 2);
    fStack_9c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_348 = (float)*(undefined8 *)(pfStack_730 + 4);
    fStack_344 = (float)((ulong)*(undefined8 *)(pfStack_730 + 4) >> 0x20);
    fStack_340 = (float)*(undefined8 *)(pfStack_730 + 6);
    fStack_33c = (float)((ulong)*(undefined8 *)(pfStack_730 + 6) >> 0x20);
    local_c8 = (float)*(undefined8 *)(input0 + 4);
    fStack_c4 = (float)((ulong)*(undefined8 *)(input0 + 4) >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(input0 + 6);
    fStack_bc = (float)((ulong)*(undefined8 *)(input0 + 6) >> 0x20);
    local_368 = (float)*(undefined8 *)(pfStack_730 + 8);
    fStack_364 = (float)((ulong)*(undefined8 *)(pfStack_730 + 8) >> 0x20);
    fStack_360 = (float)*(undefined8 *)(pfStack_730 + 10);
    fStack_35c = (float)((ulong)*(undefined8 *)(pfStack_730 + 10) >> 0x20);
    local_e8 = (float)*(undefined8 *)(input0 + 8);
    fStack_e4 = (float)((ulong)*(undefined8 *)(input0 + 8) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(input0 + 10);
    fStack_dc = (float)((ulong)*(undefined8 *)(input0 + 10) >> 0x20);
    local_388 = (float)*(undefined8 *)(pfStack_730 + 0xc);
    fStack_384 = (float)((ulong)*(undefined8 *)(pfStack_730 + 0xc) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(pfStack_730 + 0xe);
    fStack_37c = (float)((ulong)*(undefined8 *)(pfStack_730 + 0xe) >> 0x20);
    local_108 = (float)*(undefined8 *)(input0 + 0xc);
    fStack_104 = (float)((ulong)*(undefined8 *)(input0 + 0xc) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(input0 + 0xe);
    fStack_fc = (float)((ulong)*(undefined8 *)(input0 + 0xe) >> 0x20);
    local_3a8 = (float)*(undefined8 *)pfStack_740;
    fStack_3a4 = (float)((ulong)*(undefined8 *)pfStack_740 >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)(pfStack_740 + 2);
    fStack_39c = (float)((ulong)*(undefined8 *)(pfStack_740 + 2) >> 0x20);
    local_3c8 = (float)*(undefined8 *)(pfStack_740 + 4);
    fStack_3c4 = (float)((ulong)*(undefined8 *)(pfStack_740 + 4) >> 0x20);
    fStack_3c0 = (float)*(undefined8 *)(pfStack_740 + 6);
    fStack_3bc = (float)((ulong)*(undefined8 *)(pfStack_740 + 6) >> 0x20);
    local_3e8 = (float)*(undefined8 *)(pfStack_740 + 8);
    fStack_3e4 = (float)((ulong)*(undefined8 *)(pfStack_740 + 8) >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)(pfStack_740 + 10);
    fStack_3dc = (float)((ulong)*(undefined8 *)(pfStack_740 + 10) >> 0x20);
    local_408 = (float)*(undefined8 *)(pfStack_740 + 0xc);
    fStack_404 = (float)((ulong)*(undefined8 *)(pfStack_740 + 0xc) >> 0x20);
    fStack_400 = (float)*(undefined8 *)(pfStack_740 + 0xe);
    fStack_3fc = (float)((ulong)*(undefined8 *)(pfStack_740 + 0xe) >> 0x20);
    local_428 = (float)*(undefined8 *)pfStack_750;
    fStack_424 = (float)((ulong)*(undefined8 *)pfStack_750 >> 0x20);
    fStack_420 = (float)*(undefined8 *)(pfStack_750 + 2);
    fStack_41c = (float)((ulong)*(undefined8 *)(pfStack_750 + 2) >> 0x20);
    local_448 = (float)*(undefined8 *)(pfStack_750 + 4);
    fStack_444 = (float)((ulong)*(undefined8 *)(pfStack_750 + 4) >> 0x20);
    fStack_440 = (float)*(undefined8 *)(pfStack_750 + 6);
    fStack_43c = (float)((ulong)*(undefined8 *)(pfStack_750 + 6) >> 0x20);
    local_468 = (float)*(undefined8 *)(pfStack_750 + 8);
    fStack_464 = (float)((ulong)*(undefined8 *)(pfStack_750 + 8) >> 0x20);
    fStack_460 = (float)*(undefined8 *)(pfStack_750 + 10);
    fStack_45c = (float)((ulong)*(undefined8 *)(pfStack_750 + 10) >> 0x20);
    local_488 = (float)*(undefined8 *)(pfStack_750 + 0xc);
    fStack_484 = (float)((ulong)*(undefined8 *)(pfStack_750 + 0xc) >> 0x20);
    fStack_480 = (float)*(undefined8 *)(pfStack_750 + 0xe);
    fStack_47c = (float)((ulong)*(undefined8 *)(pfStack_750 + 0xe) >> 0x20);
    local_4a8 = (float)*(undefined8 *)pfStack_760;
    fStack_4a4 = (float)((ulong)*(undefined8 *)pfStack_760 >> 0x20);
    fStack_4a0 = (float)*(undefined8 *)(pfStack_760 + 2);
    fStack_49c = (float)((ulong)*(undefined8 *)(pfStack_760 + 2) >> 0x20);
    o1[3] = fStack_a4 + fStack_324 * fVar1 + fStack_3a4 * fVar2 + fStack_424 * fVar3 +
            fStack_4a4 * fVar4;
    o1[2] = local_a8 + local_328 * fVar1 + local_3a8 * fVar2 + local_428 * fVar3 + local_4a8 * fVar4
    ;
    o0[1] = fStack_9c + fStack_31c * fVar1 + fStack_39c * fVar2 + fStack_41c * fVar3 +
            fStack_49c * fVar4;
    o0[0] = fStack_a0 + fStack_320 * fVar1 + fStack_3a0 * fVar2 + fStack_420 * fVar3 +
            fStack_4a0 * fVar4;
    local_4c8 = (float)*(undefined8 *)(pfStack_760 + 4);
    fStack_4c4 = (float)((ulong)*(undefined8 *)(pfStack_760 + 4) >> 0x20);
    fStack_4c0 = (float)*(undefined8 *)(pfStack_760 + 6);
    fStack_4bc = (float)((ulong)*(undefined8 *)(pfStack_760 + 6) >> 0x20);
    o2[3] = fStack_c4 + fStack_344 * fVar1 + fStack_3c4 * fVar2 + fStack_444 * fVar3 +
            fStack_4c4 * fVar4;
    o2[2] = local_c8 + local_348 * fVar1 + local_3c8 * fVar2 + local_448 * fVar3 + local_4c8 * fVar4
    ;
    o1[1] = fStack_bc + fStack_33c * fVar1 + fStack_3bc * fVar2 + fStack_43c * fVar3 +
            fStack_4bc * fVar4;
    o1[0] = fStack_c0 + fStack_340 * fVar1 + fStack_3c0 * fVar2 + fStack_440 * fVar3 +
            fStack_4c0 * fVar4;
    local_4e8 = (float)*(undefined8 *)(pfStack_760 + 8);
    fStack_4e4 = (float)((ulong)*(undefined8 *)(pfStack_760 + 8) >> 0x20);
    fStack_4e0 = (float)*(undefined8 *)(pfStack_760 + 10);
    fStack_4dc = (float)((ulong)*(undefined8 *)(pfStack_760 + 10) >> 0x20);
    o3[3] = fStack_e4 + fStack_364 * fVar1 + fStack_3e4 * fVar2 + fStack_464 * fVar3 +
            fStack_4e4 * fVar4;
    o3[2] = local_e8 + local_368 * fVar1 + local_3e8 * fVar2 + local_468 * fVar3 + local_4e8 * fVar4
    ;
    o2[1] = fStack_dc + fStack_35c * fVar1 + fStack_3dc * fVar2 + fStack_45c * fVar3 +
            fStack_4dc * fVar4;
    o2[0] = fStack_e0 + fStack_360 * fVar1 + fStack_3e0 * fVar2 + fStack_460 * fVar3 +
            fStack_4e0 * fVar4;
    local_508 = (float)*(undefined8 *)(pfStack_760 + 0xc);
    fStack_504 = (float)((ulong)*(undefined8 *)(pfStack_760 + 0xc) >> 0x20);
    fStack_500 = (float)*(undefined8 *)(pfStack_760 + 0xe);
    fStack_4fc = (float)((ulong)*(undefined8 *)(pfStack_760 + 0xe) >> 0x20);
    r0[3] = fStack_104 + fStack_384 * fVar1 + fStack_404 * fVar2 + fStack_484 * fVar3 +
            fStack_504 * fVar4;
    r0[2] = local_108 + local_388 * fVar1 + local_408 * fVar2 + local_488 * fVar3 +
            local_508 * fVar4;
    o3[1] = fStack_fc + fStack_37c * fVar1 + fStack_3fc * fVar2 + fStack_47c * fVar3 +
            fStack_4fc * fVar4;
    o3[0] = fStack_100 + fStack_380 * fVar1 + fStack_400 * fVar2 + fStack_480 * fVar3 +
            fStack_500 * fVar4;
    *(undefined8 *)input0 = o1._8_8_;
    *(undefined8 *)(input0 + 2) = o0._0_8_;
    *(undefined8 *)(input0 + 4) = o2._8_8_;
    *(undefined8 *)(input0 + 6) = o1._0_8_;
    *(undefined8 *)(input0 + 8) = o3._8_8_;
    *(undefined8 *)(input0 + 10) = o2._0_8_;
    *(undefined8 *)(input0 + 0xc) = r0._8_8_;
    *(undefined8 *)(input0 + 0xe) = o3._0_8_;
    input0 = input0 + 0x10;
    pfStack_740 = pfStack_740 + 0x10;
    pfStack_750 = pfStack_750 + 0x10;
    pfStack_760 = pfStack_760 + 0x10;
  }
  for (; 0xf < (long)input0_end - (long)pfStack_730; pfStack_730 = pfStack_730 + 4) {
    local_528 = (float)*(undefined8 *)pfStack_730;
    fStack_524 = (float)((ulong)*(undefined8 *)pfStack_730 >> 0x20);
    fStack_520 = (float)*(undefined8 *)(pfStack_730 + 2);
    fStack_51c = (float)((ulong)*(undefined8 *)(pfStack_730 + 2) >> 0x20);
    local_2a8 = (float)*(undefined8 *)input0;
    fStack_2a4 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(input0 + 2);
    fStack_29c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_548 = (float)*(undefined8 *)pfStack_740;
    fStack_544 = (float)((ulong)*(undefined8 *)pfStack_740 >> 0x20);
    fStack_540 = (float)*(undefined8 *)(pfStack_740 + 2);
    fStack_53c = (float)((ulong)*(undefined8 *)(pfStack_740 + 2) >> 0x20);
    local_568 = (float)*(undefined8 *)pfStack_750;
    fStack_564 = (float)((ulong)*(undefined8 *)pfStack_750 >> 0x20);
    fStack_560 = (float)*(undefined8 *)(pfStack_750 + 2);
    fStack_55c = (float)((ulong)*(undefined8 *)(pfStack_750 + 2) >> 0x20);
    local_588 = (float)*(undefined8 *)pfStack_760;
    fStack_584 = (float)((ulong)*(undefined8 *)pfStack_760 >> 0x20);
    fStack_580 = (float)*(undefined8 *)(pfStack_760 + 2);
    fStack_57c = (float)((ulong)*(undefined8 *)(pfStack_760 + 2) >> 0x20);
    r0_1[3] = fStack_2a4 + fStack_524 * fVar1 + fStack_544 * fVar2 + fStack_564 * fVar3 +
              fStack_584 * fVar4;
    r0_1[2] = local_2a8 + local_528 * fVar1 + local_548 * fVar2 + local_568 * fVar3 +
              local_588 * fVar4;
    o0_1[1] = fStack_29c + fStack_51c * fVar1 + fStack_53c * fVar2 + fStack_55c * fVar3 +
              fStack_57c * fVar4;
    o0_1[0] = fStack_2a0 + fStack_520 * fVar1 + fStack_540 * fVar2 + fStack_560 * fVar3 +
              fStack_580 * fVar4;
    *(undefined8 *)input0 = r0_1._8_8_;
    *(undefined8 *)(input0 + 2) = o0_1._0_8_;
    input0 = input0 + 4;
    pfStack_740 = pfStack_740 + 4;
    pfStack_750 = pfStack_750 + 4;
    pfStack_760 = pfStack_760 + 4;
  }
  for (; pfStack_730 < input0_end; pfStack_730 = pfStack_730 + 1) {
    *input0 = *pfStack_760 * fVar4 +
              *pfStack_750 * fVar3 + *pfStack_740 * fVar2 + *input0 + *pfStack_730 * fVar1;
    input0 = input0 + 1;
    pfStack_740 = pfStack_740 + 1;
    pfStack_750 = pfStack_750 + 1;
    pfStack_760 = pfStack_760 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}